

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O1

void save_column(int symbol,int default_state)

{
  int iVar1;
  int iVar2;
  Yshort *pYVar3;
  Yshort *pYVar4;
  long lVar5;
  int *piVar6;
  Yshort *pYVar7;
  int *piVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  
  lVar5 = (long)symbol;
  iVar1 = goto_map[lVar5];
  lVar11 = (long)iVar1;
  iVar2 = goto_map[lVar5 + 1];
  iVar10 = 0;
  if (iVar1 < iVar2) {
    iVar10 = 0;
    lVar9 = lVar11;
    do {
      iVar10 = iVar10 + (uint)(to_state[lVar9] != default_state);
      lVar9 = lVar9 + 1;
    } while (iVar2 != lVar9);
  }
  if (iVar10 != 0) {
    lVar5 = (long)nstates * 3 + (long)symbol_value[lVar5];
    piVar6 = (int *)allocate(iVar10 * 4);
    froms[lVar5] = piVar6;
    pYVar7 = (Yshort *)allocate(iVar10 * 4);
    tos[lVar5] = pYVar7;
    pYVar4 = to_state;
    pYVar3 = from_state;
    piVar8 = piVar6;
    if (iVar1 < iVar2) {
      do {
        if (pYVar4[lVar11] != default_state) {
          *piVar8 = pYVar3[lVar11];
          piVar8 = piVar8 + 1;
          *pYVar7 = pYVar4[lVar11];
          pYVar7 = pYVar7 + 1;
        }
        lVar11 = lVar11 + 1;
      } while (iVar2 != lVar11);
    }
    tally[lVar5] = iVar10;
    width[lVar5] = (piVar8[-1] - *piVar6) + 1;
  }
  return;
}

Assistant:

void save_column(int symbol, int default_state)
{
    register int i;
    register int m;
    register int n;
    register Yshort *sp;
    register Yshort *sp1;
    register Yshort *sp2;
    register int count;
    register int symno;

    m = goto_map[symbol];
    n = goto_map[symbol + 1];

    count = 0;
    for (i = m; i < n; i++)
    {
	if (to_state[i] != default_state)
	    ++count;
    }
    if (count == 0) return;

    symno = symbol_value[symbol] + 3*nstates;

    froms[symno] = sp1 = sp = NEW2(count, Yshort);
    tos[symno] = sp2 = NEW2(count, Yshort);

    for (i = m; i < n; i++)
    {
	if (to_state[i] != default_state)
	{
	    *sp1++ = from_state[i];
	    *sp2++ = to_state[i];
	}
    }

    tally[symno] = count;
    width[symno] = sp1[-1] - sp[0] + 1;
}